

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpsession.cpp
# Opt level: O2

int __thiscall jrtplib::RTPSession::SetDefaultMark(RTPSession *this,bool m)

{
  int iVar1;
  
  if (this->created == true) {
    if ((this->packetbuilder).init == true) {
      (this->packetbuilder).defmarkset = true;
      (this->packetbuilder).defaultmark = m;
      return 0;
    }
    iVar1 = -0x14;
  }
  else {
    iVar1 = -0x3e;
  }
  return iVar1;
}

Assistant:

int RTPSession::SetDefaultMark(bool m)
{
	if (!created)
		return ERR_RTP_SESSION_NOTCREATED;

	int status;

	BUILDER_LOCK
	status = packetbuilder.SetDefaultMark(m);
	BUILDER_UNLOCK
	return status;
}